

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O1

long mk_cust(long n_cust,customer_t *c)

{
  set_member *psVar1;
  long lVar2;
  int iVar3;
  long seed;
  long i;
  long local_30;
  
  c->custkey = n_cust;
  sprintf(c->name,"%s%09ld","Customer#",n_cust);
  iVar3 = a_rnd(6,0x18,0x1a,c->address);
  c->alen = iVar3;
  dss_random(&local_30,0,(long)nations.count + -1,0x1b);
  lVar2 = local_30;
  psVar1 = nations.list;
  strcpy(c->nation_name,nations.list[local_30].text);
  strcpy(c->region_name,regions.list[psVar1[lVar2].weight].text);
  gen_city(c->city,c->nation_name);
  gen_phone(local_30,c->phone,seed);
  pick_str(&c_mseg_set,0x1e,c->mktsegment);
  return 0;
}

Assistant:

long mk_cust(long n_cust, customer_t *c)
{
        long i;
        c->custkey = n_cust;
	sprintf(c->name, C_NAME_FMT, C_NAME_TAG, n_cust);
	c->alen = V_STR(C_ADDR_LEN, C_ADDR_SD, c->address);
    RANDOM(i, 0, nations.count-1, C_NTRG_SD);
	strcpy(c->nation_name,nations.list[i].text);
	strcpy(c->region_name,regions.list[nations.list[i].weight].text);
	gen_city(c->city,c->nation_name);
	gen_phone(i, c->phone, (long)C_PHNE_SD);
        pick_str(&c_mseg_set, C_MSEG_SD, c->mktsegment);
	return (0);
 }